

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealights_ltc_file.cpp
# Opt level: O2

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> __thiscall
alf::read_alf_file(alf *this,string *filename)

{
  char (*pacVar1) [4];
  FILE *__stream;
  uint uVar2;
  alf_header header;
  vector<float,_std::allocator<float>_> texture_slot2;
  vector<float,_std::allocator<float>_> texture_slot1;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (((__stream != (FILE *)0x0) &&
      (fread(&header,0x10,1,__stream), header.id == (char  [4])0x464c41)) &&
     (uVar2 = header.num_samples_angle * header.num_samples_roughness, uVar2 != 0)) {
    texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&texture_slot1,(ulong)(uVar2 * 4));
    fread(texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start,0x10,(ulong)uVar2,__stream);
    texture_slot2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texture_slot2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texture_slot2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&texture_slot2,(ulong)(uVar2 * 3));
    fread(texture_slot2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start,0xc,(ulong)uVar2,__stream);
    fclose(__stream);
    std::make_unique<alf::alf_file>();
    pacVar1 = *(char (**) [4])this;
    *pacVar1 = header.id;
    pacVar1[1] = (char  [4])header._4_4_;
    pacVar1[2] = (char  [4])header.num_samples_angle;
    pacVar1[3] = (char  [4])header.num_samples_roughness;
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              ((vector<float,_std::allocator<float>_> *)(pacVar1 + 4),
               &texture_slot1.super__Vector_base<float,_std::allocator<float>_>);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              ((vector<float,_std::allocator<float>_> *)(*(long *)this + 0x28),
               &texture_slot2.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texture_slot2.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texture_slot1.super__Vector_base<float,_std::allocator<float>_>);
    return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
           (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)this;
  }
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)this;
}

Assistant:

std::unique_ptr<alf::alf_file> alf::read_alf_file(const std::string &filename)
{
  auto file = fopen(filename.c_str(), "rb");
  if (!file) {
    return nullptr;
  }

  alf::alf_header header;
  std::fread(&header, sizeof(alf::alf_header), 1, file);

  if (std::strcmp(header.id, "ALF") != 0) {
    return nullptr;
  }

  auto num_samples = header.num_samples_roughness * header.num_samples_angle;
  if (num_samples <= 0) {
    return nullptr;
  }

  std::vector<float> texture_slot1;
  texture_slot1.resize(4 * header.num_samples_angle * header.num_samples_roughness);
  std::fread(&texture_slot1[0], sizeof(float)*4, num_samples, file);

  std::vector<float> texture_slot2;
  texture_slot2.resize(3 * header.num_samples_angle * header.num_samples_roughness);
  std::fread(&texture_slot2[0], sizeof(float)*3, num_samples, file);

  std::fclose(file);

  auto alf_file = std::make_unique<alf::alf_file>();
  alf_file->header = std::move(header);
  alf_file->texture_slot1 = std::move(texture_slot1);
  alf_file->texture_slot2 = std::move(texture_slot2);
  return alf_file;
}